

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TiledRgbaInputFile::FromYa::readTile(FromYa *this,int dx,int dy,int lx,int ly)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  char *pcVar5;
  ArgExc *this_00;
  Rgba *pRVar6;
  int iVar7;
  V3f *in_RDI;
  int in_stack_00000018;
  int in_stack_0000001c;
  int in_stack_00000020;
  int in_stack_00000024;
  TiledInputFile *in_stack_00000028;
  Rgba *ptr;
  int x1_1;
  int x;
  int x1;
  int y1;
  int y;
  intptr_t base;
  int width;
  Box2i dw;
  stringstream _iex_throw_s;
  float *in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  undefined8 in_stack_fffffffffffffde8;
  TiledInputFile *in_stack_fffffffffffffdf0;
  Rgba *in_stack_fffffffffffffdf8;
  Rgba *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  stringstream local_1a0 [16];
  ostream local_190 [400];
  
  lVar1._0_4_ = in_RDI[8].x;
  lVar1._4_4_ = in_RDI[8].y;
  if (lVar1 == 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar4 = std::operator<<(local_190,
                             "No frame buffer was specified as the pixel data destination for image file \""
                            );
    pcVar5 = TiledInputFile::fileName((TiledInputFile *)0x24cee1);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4,"\".");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,local_1a0);
    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  TiledInputFile::readTile
            (in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
             (int)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,in_stack_fffffffffffffde0);
  TiledInputFile::dataWindowForTile
            (in_stack_00000028,in_stack_00000024,in_stack_00000020,in_stack_0000001c,
             in_stack_00000018);
  iVar7 = (local_1b4 - local_1bc) + 1;
  lVar1 = *(long *)(in_RDI + 8);
  local_1d0 = 0;
  for (local_1cc = local_1b8; local_1cc <= local_1b0; local_1cc = local_1cc + 1) {
    for (local_1d4 = 0; local_1d4 < iVar7; local_1d4 = local_1d4 + 1) {
      Array2D<Imf_3_4::Rgba>::operator[]((Array2D<Imf_3_4::Rgba> *)(in_RDI + 6),(long)local_1d0);
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 (float)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
      Array2D<Imf_3_4::Rgba>::operator[]((Array2D<Imf_3_4::Rgba> *)(in_RDI + 6),(long)local_1d0);
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 (float)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    }
    in_stack_fffffffffffffdd8 = &in_RDI[4].z;
    in_stack_fffffffffffffde4 = iVar7;
    Array2D<Imf_3_4::Rgba>::operator[]((Array2D<Imf_3_4::Rgba> *)(in_RDI + 6),(long)local_1d0);
    Array2D<Imf_3_4::Rgba>::operator[]((Array2D<Imf_3_4::Rgba> *)(in_RDI + 6),(long)local_1d0);
    RgbaYca::YCAtoRGBA(in_RDI,(int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                       in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    local_1dc = 0;
    for (local_1d8 = local_1bc; local_1d8 <= local_1b4; local_1d8 = local_1d8 + 1) {
      lVar2 = *(long *)&in_RDI[8].z;
      lVar3 = *(long *)&in_RDI[9].y;
      pRVar6 = Array2D<Imf_3_4::Rgba>::operator[]
                         ((Array2D<Imf_3_4::Rgba> *)(in_RDI + 6),(long)local_1d0);
      *(Rgba *)(lVar1 + (local_1d8 * lVar2 + local_1cc * lVar3) * 8) = pRVar6[local_1dc];
      local_1dc = local_1dc + 1;
    }
    local_1d0 = local_1d0 + 1;
  }
  return;
}

Assistant:

void
TiledRgbaInputFile::FromYa::readTile (int dx, int dy, int lx, int ly)
{
    if (_fbBase == 0)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "No frame buffer was specified as the "
            "pixel data destination for image file "
            "\"" << _inputFile.fileName ()
                 << "\".");
    }

    //
    // Read the tile requested by the caller into _buf.
    //

    _inputFile.readTile (dx, dy, lx, ly);

    //
    // Convert the luminance/alpha pixels to RGBA
    // and copy them into the caller's frame buffer.
    //

    Box2i    dw    = _inputFile.dataWindowForTile (dx, dy, lx, ly);
    int      width = dw.max.x - dw.min.x + 1;
    intptr_t base  = reinterpret_cast<intptr_t> (_fbBase);

    for (int y = dw.min.y, y1 = 0; y <= dw.max.y; ++y, ++y1)
    {
        for (int x1 = 0; x1 < width; ++x1)
        {
            _buf[y1][x1].r = 0;
            _buf[y1][x1].b = 0;
        }

        YCAtoRGBA (_yw, width, _buf[y1], _buf[y1]);

        for (int x = dw.min.x, x1 = 0; x <= dw.max.x; ++x, ++x1)
        {
            Rgba* ptr = reinterpret_cast<Rgba*> (
                base + sizeof (Rgba) * (x * _fbXStride + y * _fbYStride));
            *ptr = _buf[y1][x1];
        }
    }
}